

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GLSL420Pack::QualifierOrderBlockTest::testInit(QualifierOrderBlockTest *this)

{
  vector<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
  *this_00;
  pointer pQVar1;
  QUALIFIERS *pQVar2;
  iterator iVar3;
  pointer this_01;
  QUALIFIERS local_14;
  
  this_00 = &this->m_test_cases;
  std::
  vector<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
  ::resize(this_00,4);
  this_01 = (this->m_test_cases).
            super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar3._M_current =
       (this_01->
       super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  pQVar1 = (this_01->
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == pQVar1) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar3._M_current =
         (this_01->
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    pQVar1 = (this_01->
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = QUAL_HIGHP;
    iVar3._M_current = iVar3._M_current + 1;
    (this_01->
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    )._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == pQVar1) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar3._M_current =
         (this_01->
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    pQVar1 = (this_01->
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = QUAL_FLAT;
    iVar3._M_current = iVar3._M_current + 1;
    (this_01->
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    )._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == pQVar1) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    *iVar3._M_current = QUAL_INVARIANT;
    (this_01->
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    )._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  iVar3._M_current =
       this_01[1].
       super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pQVar2 = this_01[1].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == pQVar2) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 1,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar3._M_current =
         this_01[1].
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pQVar2 = this_01[1].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = QUAL_LOWP;
    iVar3._M_current = iVar3._M_current + 1;
    this_01[1].
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == pQVar2) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 1,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar3._M_current =
         this_01[1].
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pQVar2 = this_01[1].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = QUAL_SAMPLE;
    iVar3._M_current = iVar3._M_current + 1;
    this_01[1].
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == pQVar2) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 1,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar3._M_current =
         this_01[1].
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pQVar2 = this_01[1].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = QUAL_NOPERSPECTIVE;
    iVar3._M_current = iVar3._M_current + 1;
    this_01[1].
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == pQVar2) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 1,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    *iVar3._M_current = QUAL_INVARIANT;
    this_01[1].
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  iVar3._M_current =
       this_01[2].
       super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pQVar2 = this_01[2].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == pQVar2) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 2,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar3._M_current =
         this_01[2].
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pQVar2 = this_01[2].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = QUAL_HIGHP;
    iVar3._M_current = iVar3._M_current + 1;
    this_01[2].
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == pQVar2) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 2,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar3._M_current =
         this_01[2].
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pQVar2 = this_01[2].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = QUAL_SMOOTH;
    iVar3._M_current = iVar3._M_current + 1;
    this_01[2].
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == pQVar2) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 2,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    *iVar3._M_current = QUAL_INVARIANT;
    this_01[2].
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  iVar3._M_current =
       this_01[3].
       super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pQVar2 = this_01[3].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == pQVar2) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 3,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar3._M_current =
         this_01[3].
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pQVar2 = this_01[3].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = QUAL_LOWP;
    iVar3._M_current = iVar3._M_current + 1;
    this_01[3].
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == pQVar2) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 3,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar3._M_current =
         this_01[3].
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pQVar2 = this_01[3].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = QUAL_SAMPLE;
    iVar3._M_current = iVar3._M_current + 1;
    this_01[3].
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == pQVar2) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 3,iVar3,&local_14);
    this_01 = (this_00->
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar3._M_current =
         this_01[3].
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pQVar2 = this_01[3].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = QUAL_NOPERSPECTIVE;
    iVar3._M_current = iVar3._M_current + 1;
    this_01[3].
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == pQVar2) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 3,iVar3,&local_14);
  }
  else {
    *iVar3._M_current = QUAL_INVARIANT;
    this_01[3].
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  return true;
}

Assistant:

bool QualifierOrderBlockTest::testInit()
{
	m_test_cases.resize(4);

	m_test_cases[0].push_back(Utils::QUAL_HIGHP);
	m_test_cases[0].push_back(Utils::QUAL_FLAT);
	m_test_cases[0].push_back(Utils::QUAL_INVARIANT);

	m_test_cases[1].push_back(Utils::QUAL_LOWP);
	m_test_cases[1].push_back(Utils::QUAL_SAMPLE);
	m_test_cases[1].push_back(Utils::QUAL_NOPERSPECTIVE);
	m_test_cases[1].push_back(Utils::QUAL_INVARIANT);

	m_test_cases[2].push_back(Utils::QUAL_HIGHP);
	m_test_cases[2].push_back(Utils::QUAL_SMOOTH);
	m_test_cases[2].push_back(Utils::QUAL_INVARIANT);

	m_test_cases[3].push_back(Utils::QUAL_LOWP);
	m_test_cases[3].push_back(Utils::QUAL_SAMPLE);
	m_test_cases[3].push_back(Utils::QUAL_NOPERSPECTIVE);
	m_test_cases[3].push_back(Utils::QUAL_INVARIANT);

	return true;
}